

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_wrapper_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::WrapperFieldGenerator::GenerateExtensionCode
          (WrapperFieldGenerator *this,Printer *printer)

{
  Printer *in_RSI;
  Printer *in_RDI;
  char *in_stack_00000038;
  Printer *in_stack_00000040;
  char *in_stack_000001d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_000001d8;
  Printer *in_stack_000001e0;
  
  WritePropertyDocComment(in_RSI,(FieldDescriptor *)in_RDI);
  FieldGeneratorBase::AddDeprecatedFlag((FieldGeneratorBase *)in_RSI,in_RDI);
  io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
  (**(code **)(*(long *)in_RDI + 0x20))(in_RDI,in_RSI);
  io::Printer::Print<>(in_stack_00000040,in_stack_00000038);
  return;
}

Assistant:

void WrapperFieldGenerator::GenerateExtensionCode(io::Printer* printer) {
  WritePropertyDocComment(printer, descriptor_);
  AddDeprecatedFlag(printer);
  printer->Print(
    variables_,
    "$access_level$ static readonly pb::Extension<$extended_type$, $type_name$> $property_name$ =\n"
    "  new pb::Extension<$extended_type$, $type_name$>($number$, ");
  GenerateCodecCode(printer);
  printer->Print(");\n");
}